

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::qualSlackViolation
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxviol,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *sumviol)

{
  cpp_dec_float<100U,_int,_void> *pcVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  cpp_dec_float<100U,_int,_void> *pcVar6;
  cpp_dec_float<100U,_int,_void> *v;
  long lVar7;
  Item *pIVar8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  viol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  slacks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  solu;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  cpp_dec_float<100U,_int,_void> local_178;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_120;
  cpp_dec_float<100U,_int,_void> local_118;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_c8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_b0;
  cpp_dec_float<100U,_int,_void> *local_98;
  long local_90;
  cpp_dec_float<100U,_int,_void> local_88;
  
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)maxviol,0.0);
  local_98 = &sumviol->m_backend;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)sumviol,0.0);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_b0,
               (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_c8,
               (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x60])(this,&local_b0);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x61])(this,&local_c8);
  if (0 < (this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar5 = 0;
    local_120 = this;
    do {
      pIVar8 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem +
               (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[lVar5].idx;
      local_88.fpclass = cpp_dec_float_finite;
      local_88.prec_elem = 0x10;
      local_88.data._M_elems[0] = 0;
      local_88.data._M_elems[1] = 0;
      local_88.data._M_elems[2] = 0;
      local_88.data._M_elems[3] = 0;
      local_88.data._M_elems[4] = 0;
      local_88.data._M_elems[5] = 0;
      local_88.data._M_elems[6] = 0;
      local_88.data._M_elems[7] = 0;
      local_88.data._M_elems[8] = 0;
      local_88.data._M_elems[9] = 0;
      local_88.data._M_elems[10] = 0;
      local_88.data._M_elems[0xb] = 0;
      local_88.data._M_elems[0xc] = 0;
      local_88.data._M_elems[0xd] = 0;
      local_88.data._M_elems._56_5_ = 0;
      local_88.data._M_elems[0xf]._1_3_ = 0;
      local_88.exp = 0;
      local_88.neg = false;
      local_90 = lVar5;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_88,0.0);
      if (0 < (pIVar8->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        lVar7 = 0;
        lVar5 = 0;
        do {
          pNVar2 = (pIVar8->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pcVar6 = &local_b0.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(int *)((long)(&pNVar2->val + 1) + lVar7)].m_backend;
          pcVar1 = (cpp_dec_float<100U,_int,_void> *)
                   ((long)(pNVar2->val).m_backend.data._M_elems + lVar7);
          local_178.fpclass = cpp_dec_float_finite;
          local_178.prec_elem = 0x10;
          local_178.data._M_elems[0] = 0;
          local_178.data._M_elems[1] = 0;
          local_178.data._M_elems[2] = 0;
          local_178.data._M_elems[3] = 0;
          local_178.data._M_elems[4] = 0;
          local_178.data._M_elems[5] = 0;
          local_178.data._M_elems[6] = 0;
          local_178.data._M_elems[7] = 0;
          local_178.data._M_elems[8] = 0;
          local_178.data._M_elems[9] = 0;
          local_178.data._M_elems[10] = 0;
          local_178.data._M_elems[0xb] = 0;
          local_178.data._M_elems[0xc] = 0;
          local_178.data._M_elems[0xd] = 0;
          local_178.data._M_elems._56_5_ = 0;
          local_178.data._M_elems[0xf]._1_3_ = 0;
          local_178.exp = 0;
          local_178.neg = false;
          v = pcVar1;
          if ((&local_178 != pcVar6) && (v = pcVar6, pcVar1 != &local_178)) {
            local_178.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
            local_178.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
            local_178.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            local_178.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            local_178.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_178.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
            local_178.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
            uVar3 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
            local_178.data._M_elems._56_5_ = SUB85(uVar3,0);
            local_178.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_178.exp = *(int *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar7);
            local_178.neg = *(bool *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar7 + 4);
            local_178._72_8_ =
                 *(undefined8 *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar7 + 8);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_178,v);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    (&local_88,&local_178);
          lVar5 = lVar5 + 1;
          lVar7 = lVar7 + 0x54;
        } while (lVar5 < (pIVar8->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused);
      }
      lVar5 = local_90;
      local_118.fpclass = cpp_dec_float_finite;
      local_118.prec_elem = 0x10;
      local_118.data._M_elems[0] = 0;
      local_118.data._M_elems[1] = 0;
      local_118.data._M_elems[2] = 0;
      local_118.data._M_elems[3] = 0;
      local_118.data._M_elems[4] = 0;
      local_118.data._M_elems[5] = 0;
      local_118.data._M_elems[6] = 0;
      local_118.data._M_elems[7] = 0;
      local_118.data._M_elems[8] = 0;
      local_118.data._M_elems[9] = 0;
      local_118.data._M_elems[10] = 0;
      local_118.data._M_elems[0xb] = 0;
      local_118.data._M_elems[0xc] = 0;
      local_118.data._M_elems[0xd] = 0;
      local_118.data._M_elems._56_5_ = 0;
      local_118.data._M_elems[0xf]._1_3_ = 0;
      local_118.exp = 0;
      local_118.neg = false;
      if (&local_118 ==
          &local_c8.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_90].m_backend) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_118,&local_88);
        if (local_118.data._M_elems[0] == 0 && local_118.fpclass == cpp_dec_float_finite) {
          local_178.fpclass = cpp_dec_float_finite;
        }
        else {
          local_118.neg = (bool)(local_118.neg ^ 1);
          local_178.fpclass = local_118.fpclass;
        }
      }
      else {
        local_118.data._M_elems[0xc] = local_88.data._M_elems[0xc];
        local_118.data._M_elems[0xd] = local_88.data._M_elems[0xd];
        local_118.data._M_elems._56_5_ = local_88.data._M_elems._56_5_;
        local_118.data._M_elems[0xf]._1_3_ = local_88.data._M_elems[0xf]._1_3_;
        local_118.data._M_elems[8] = local_88.data._M_elems[8];
        local_118.data._M_elems[9] = local_88.data._M_elems[9];
        local_118.data._M_elems[10] = local_88.data._M_elems[10];
        local_118.data._M_elems[0xb] = local_88.data._M_elems[0xb];
        local_118.data._M_elems[4] = local_88.data._M_elems[4];
        local_118.data._M_elems[5] = local_88.data._M_elems[5];
        local_118.data._M_elems[6] = local_88.data._M_elems[6];
        local_118.data._M_elems[7] = local_88.data._M_elems[7];
        local_118.data._M_elems[0] = local_88.data._M_elems[0];
        local_118.data._M_elems[1] = local_88.data._M_elems[1];
        local_118.data._M_elems[2] = local_88.data._M_elems[2];
        local_118.data._M_elems[3] = local_88.data._M_elems[3];
        local_118.exp = local_88.exp;
        local_118.neg = local_88.neg;
        local_118.fpclass = local_88.fpclass;
        local_118.prec_elem = local_88.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_118,
                   &local_c8.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_90].m_backend);
        local_178.fpclass = local_118.fpclass;
      }
      this = local_120;
      local_178.data._M_elems[0xc] = local_118.data._M_elems[0xc];
      local_178.data._M_elems[0xd] = local_118.data._M_elems[0xd];
      local_178.data._M_elems._56_5_ = local_118.data._M_elems._56_5_;
      local_178.data._M_elems[0xf]._1_3_ = local_118.data._M_elems[0xf]._1_3_;
      local_178.data._M_elems[8] = local_118.data._M_elems[8];
      local_178.data._M_elems[9] = local_118.data._M_elems[9];
      local_178.data._M_elems[10] = local_118.data._M_elems[10];
      local_178.data._M_elems[0xb] = local_118.data._M_elems[0xb];
      local_178.data._M_elems[4] = local_118.data._M_elems[4];
      local_178.data._M_elems[5] = local_118.data._M_elems[5];
      local_178.data._M_elems[6] = local_118.data._M_elems[6];
      local_178.data._M_elems[7] = local_118.data._M_elems[7];
      local_178.data._M_elems[0] = local_118.data._M_elems[0];
      local_178.data._M_elems[1] = local_118.data._M_elems[1];
      uVar3 = local_178.data._M_elems._0_8_;
      local_178.data._M_elems[2] = local_118.data._M_elems[2];
      local_178.data._M_elems[3] = local_118.data._M_elems[3];
      local_178.exp = local_118.exp;
      local_178.prec_elem = local_118.prec_elem;
      local_178.neg = local_118.neg;
      if (((local_118.neg & 1U) != 0) &&
         (local_178.data._M_elems[0] = local_118.data._M_elems[0],
         local_178.data._M_elems[0] != 0 || local_178.fpclass != cpp_dec_float_finite)) {
        local_178.neg = (bool)(local_118.neg ^ 1);
      }
      local_178.data._M_elems._0_8_ = uVar3;
      if (((local_178.fpclass != cpp_dec_float_NaN) &&
          ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&local_178,&maxviol->m_backend), 0 < iVar4)) {
        *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc) = local_178.data._M_elems._48_8_;
        *(ulong *)((maxviol->m_backend).data._M_elems + 0xe) =
             CONCAT35(local_178.data._M_elems[0xf]._1_3_,local_178.data._M_elems._56_5_);
        *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) = local_178.data._M_elems._32_8_;
        *(undefined8 *)((maxviol->m_backend).data._M_elems + 10) = local_178.data._M_elems._40_8_;
        *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = local_178.data._M_elems._16_8_;
        *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) = local_178.data._M_elems._24_8_;
        *(undefined8 *)(maxviol->m_backend).data._M_elems = local_178.data._M_elems._0_8_;
        *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_178.data._M_elems._8_8_;
        (maxviol->m_backend).exp = local_178.exp;
        (maxviol->m_backend).neg = local_178.neg;
        (maxviol->m_backend).fpclass = local_178.fpclass;
        (maxviol->m_backend).prec_elem = local_178.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (local_98,&local_178);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
  }
  if (local_c8.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::qualSlackViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());
   VectorBase<R> slacks(this->nRows());

   getPrimalSol(solu);
   getSlacks(slacks);

   for(int row = 0; row < this->nRows(); ++row)
   {
      const SVectorBase<R>& rowvec = this->rowVector(row);

      R val = 0.0;

      for(int col = 0; col < rowvec.size(); ++col)
         val += rowvec.value(col) * solu[rowvec.index(col)];

      R viol = spxAbs(val - slacks[row]);

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}